

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::makePtrBoundsCheck<wasm::AtomicWait>
          (Replacer *this,AtomicWait *curr,Index ptrIdx,Index bytes)

{
  Builder *this_00;
  BinaryOp op;
  LocalGet *left;
  Const *pCVar1;
  Binary *leftOperand;
  Expression *pEVar2;
  
  this_00 = &this->builder;
  op = Abstract::getBinary((Type)(this->parent->pointerType).id,Add);
  left = Builder::makeLocalGet(this_00,ptrIdx,(Type)(this->parent->pointerType).id);
  pCVar1 = Builder::makeConstPtr(this_00,(curr->offset).addr,(Type)(this->parent->pointerType).id);
  leftOperand = Builder::makeBinary(this_00,op,(Expression *)left,(Expression *)pCVar1);
  pCVar1 = Builder::makeConstPtr(this_00,(ulong)bytes,(Type)(this->parent->pointerType).id);
  pEVar2 = makeAddGtuMemoryTrap
                     (this,(Expression *)leftOperand,(Expression *)pCVar1,
                      (Name)(curr->memory).super_IString.str);
  return pEVar2;
}

Assistant:

Expression* makePtrBoundsCheck(T* curr, Index ptrIdx, Index bytes) {
      Expression* boundsCheck = makeAddGtuMemoryTrap(
        builder.makeBinary(
          // ptr + offset (ea from wasm spec) + bit width
          Abstract::getBinary(parent.pointerType, Abstract::Add),
          builder.makeLocalGet(ptrIdx, parent.pointerType),
          builder.makeConstPtr(curr->offset, parent.pointerType)),
        builder.makeConstPtr(bytes, parent.pointerType),
        curr->memory);
      return boundsCheck;
    }